

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O3

Expression *
slang::ast::StreamingConcatenationExpression::fromSyntax
          (Compilation *comp,StreamingConcatenationExpressionSyntax *syntax,ASTContext *context)

{
  TokenKind TVar1;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> pSVar2;
  ElementSelectSyntax *syntax_00;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  Compilation *pCVar5;
  uint uVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  SourceLocation SVar10;
  undefined4 extraout_var;
  StreamingConcatenationExpression *pSVar11;
  optional<int> value;
  undefined4 extraout_var_00;
  Type *pTVar12;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar13;
  Scope *this;
  Type *pTVar14;
  Expression *pEVar15;
  uint64_t uVar16;
  SymbolMap *pSVar17;
  Diagnostic *pDVar18;
  int iVar19;
  long lVar20;
  ASTContext *extraout_RDX;
  ASTContext *extraout_RDX_00;
  ASTContext *extraout_RDX_01;
  ASTContext *src;
  size_t extraout_RDX_02;
  ASTContext *extraout_RDX_03;
  ulong uVar21;
  EvalContext *context_00;
  SourceLocation in_R8;
  char cVar22;
  SourceRange SVar23;
  SourceRange assignmentRange;
  optional<slang::ConstantRange> oVar24;
  uint64_t bitstreamWidth;
  SmallVector<slang::ast::StreamingConcatenationExpression::StreamExpression,_4UL> buffer;
  EvalContext evalCtx;
  bitmask<slang::ast::AssignFlags> *in_stack_fffffffffffffba0;
  uint local_454;
  StreamingConcatenationExpressionSyntax *local_450;
  unsigned_long local_448;
  Compilation *local_440;
  Type *local_438;
  undefined1 local_430 [16];
  unsigned_long local_420;
  uint local_414;
  underlying_type local_410;
  long local_408;
  SmallVectorBase<slang::ast::StreamingConcatenationExpression::StreamExpression> local_400 [2];
  undefined1 local_388 [8];
  __extent_storage<18446744073709551615UL> _Stack_380;
  bitmask<slang::ast::ASTFlags> local_378;
  SourceLocation SStack_370;
  TempVarSymbol *local_368;
  RandomizeDetails *pRStack_360;
  AssertionInstanceDetails *local_358;
  bitmask<slang::ast::EvalFlags> local_350;
  undefined8 local_34c;
  undefined8 uStack_344;
  undefined4 local_33c;
  SmallVectorBase<slang::ast::EvalContext::Frame> local_338;
  LValue **local_280;
  size_type local_278;
  size_type local_270;
  LValue *local_268 [5];
  SmallVectorBase<slang::Diagnostic> local_240;
  SmallVectorBase<slang::Diagnostic> local_148;
  SourceLocation local_50;
  SourceLocation SStack_48;
  bool local_40;
  
  local_410 = (context->flags).m_bits;
  TVar1 = (syntax->operatorToken).kind;
  local_448 = 0;
  local_450 = syntax;
  if ((-1 < (char)local_410) &&
     ((((uint)local_410 >> 0x14 & 1) != 0 || (((comp->options).flags.m_bits & 0x800) == 0)))) {
    SVar10 = parsing::Token::location(&syntax->operatorToken);
    ASTContext::addDiag(context,(DiagCode)0x2a0007,SVar10);
    pTVar12 = comp->errorType;
    goto LAB_00748a82;
  }
  if (syntax->sliceSize == (ExpressionSyntax *)0x0) {
    src = context;
    if (TVar1 == LeftShift) {
      local_448 = 1;
    }
    goto LAB_00748b68;
  }
  iVar8 = Expression::bind((int)syntax->sliceSize,(sockaddr *)context,4);
  pEVar15 = (Expression *)CONCAT44(extraout_var,iVar8);
  bVar7 = Expression::bad(pEVar15);
  if (!bVar7) {
    if (pEVar15->kind == DataType) {
      bVar7 = Type::isFixedSize((pEVar15->type).ptr);
      if (bVar7) {
        local_448 = Type::getBitstreamWidth((pEVar15->type).ptr);
        src = extraout_RDX;
LAB_00748b2e:
        if (TVar1 != LeftShift) {
          local_448 = 0;
          SVar23 = slang::syntax::SyntaxNode::sourceRange(&local_450->sliceSize->super_SyntaxNode);
          ASTContext::addDiag(context,(DiagCode)0xc20007,SVar23);
          src = extraout_RDX_01;
        }
LAB_00748b68:
        local_420 = 0;
        local_400[0].len = 0;
        local_400[0].data_ = (pointer)((long)local_400 + 0x18);
        local_400[0].cap = 4;
        uVar21 = (local_450->expressions).elements._M_extent._M_extent_value + 1;
        if (1 < uVar21) {
          uVar21 = uVar21 >> 1;
          lVar20 = 0;
          local_440 = comp;
          local_438 = (Type *)context;
          do {
            pTVar12 = local_438;
            local_408 = lVar20;
            ppSVar13 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                                 ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   *)((long)&(((local_450->expressions).elements._M_ptr)->
                                             super_ConstTokenOrSyntax).
                                             super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                             .
                                             super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                             .
                                             super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                             .
                                             super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                             .
                                             super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                     + lVar20));
            pSVar2 = *ppSVar13;
            this = (Scope *)Expression::selfDetermined
                                      (local_440,*(ExpressionSyntax **)(pSVar2 + 1),
                                       (ASTContext *)pTVar12,(bitmask<slang::ast::ASTFlags>)0x80);
            bVar7 = Expression::bad((Expression *)this);
            pCVar5 = local_440;
            if (bVar7) {
              pTVar12 = local_440->errorType;
              local_454 = 0;
              local_388 = (undefined1  [8])0x0;
              _Stack_380._M_extent_value = 0;
              local_430 = (undefined1  [16])
                          slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)local_450);
              pSVar11 = BumpAllocator::
                        emplace<slang::ast::StreamingConcatenationExpression,slang::ast::Type_const&,unsigned_long&,unsigned_int,std::span<slang::ast::StreamingConcatenationExpression::StreamExpression_const,18446744073709551615ul>,slang::SourceRange>
                                  (&pCVar5->super_BumpAllocator,pTVar12,&local_448,&local_454,
                                   (span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>
                                    *)local_388,(SourceRange *)local_430);
              pSVar11 = (StreamingConcatenationExpression *)
                        Expression::badExpr(pCVar5,&pSVar11->super_Expression);
              goto LAB_0074936d;
            }
            pTVar12 = ((not_null<const_slang::ast::Type_*> *)&this->thisSym)->ptr;
            if (pSVar2[1].parent != (SyntaxNode *)0x0) {
              bVar7 = Type::isUnpackedArray(pTVar12);
              if (bVar7) {
                pTVar14 = pTVar12->canonical;
                if (pTVar14 == (Type *)0x0) {
                  Type::resolveCanonical(pTVar12);
                  pTVar14 = pTVar12->canonical;
                }
                if ((pTVar14->super_Symbol).kind != AssociativeArrayType) {
                  pTVar14 = Type::getArrayElementType(pTVar12);
                  bVar7 = Type::isFixedSize(pTVar14);
                  if (bVar7) {
                    syntax_00 = (ElementSelectSyntax *)pSVar2[1].parent[1].previewNode;
                    ASTContext::resetFlags
                              ((ASTContext *)local_388,(ASTContext *)local_438,
                               (bitmask<slang::ast::ASTFlags>)0x200000000);
                    pEVar15 = Expression::bindSelector
                                        (local_440,(Expression *)this,syntax_00,
                                         (ASTContext *)local_388);
                    bVar7 = Expression::bad(pEVar15);
                    pCVar5 = local_440;
                    if (!bVar7) {
                      local_358 = *(AssertionInstanceDetails **)
                                   &(local_438->super_Symbol).indexInScope;
                      local_388 = *(undefined1 (*) [8])&local_438->super_Symbol;
                      _Stack_380._M_extent_value = (local_438->super_Symbol).name._M_len;
                      local_378.m_bits =
                           ((bitmask<slang::ast::ASTFlags> *)&(local_438->super_Symbol).name._M_str)
                           ->m_bits;
                      SStack_370 = (local_438->super_Symbol).location;
                      local_368 = (TempVarSymbol *)(local_438->super_Symbol).parentScope;
                      pRStack_360 = (RandomizeDetails *)(local_438->super_Symbol).nextInScope;
                      local_350.m_bits = '\0';
                      local_34c = 0;
                      uStack_344 = 0;
                      local_33c = 0;
                      local_338.data_ = (pointer)local_338.firstElement;
                      local_338.len = 0;
                      local_338.cap = 2;
                      local_280 = local_268;
                      local_278 = 0;
                      local_270 = 5;
                      local_240.data_ = (pointer)local_240.firstElement;
                      local_240.len = 0;
                      local_240.cap = 2;
                      local_148.data_ = (pointer)local_148.firstElement;
                      local_148.len = 0;
                      local_148.cap = 2;
                      local_40 = false;
                      local_50 = (SourceLocation)0x0;
                      SStack_48 = (SourceLocation)0x0;
                      context_00 = (EvalContext *)local_388;
                      oVar24 = Expression::evalSelector(pEVar15,context_00,false);
                      if (((undefined1  [12])
                           oVar24.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
                           super__Optional_payload_base<slang::ConstantRange> &
                          (undefined1  [12])0x1) == (undefined1  [12])0x0) {
                        cVar22 = '\0';
                      }
                      else {
                        iVar9 = oVar24.super__Optional_base<slang::ConstantRange,_true,_true>.
                                _M_payload.super__Optional_payload_base<slang::ConstantRange>.
                                _M_payload._0_4_;
                        iVar19 = oVar24.super__Optional_base<slang::ConstantRange,_true,_true>.
                                 _M_payload.super__Optional_payload_base<slang::ConstantRange>.
                                 _M_payload._4_4_;
                        iVar8 = iVar9 - iVar19;
                        if (iVar9 - iVar19 == 0 || iVar9 < iVar19) {
                          iVar8 = -(iVar9 - iVar19);
                        }
                        local_414 = iVar8 + 1;
                        cVar22 = '\x01';
                      }
                      SmallVectorBase<slang::Diagnostic>::cleanup
                                (&local_148,(EVP_PKEY_CTX *)context_00);
                      SmallVectorBase<slang::Diagnostic>::cleanup
                                (&local_240,(EVP_PKEY_CTX *)context_00);
                      if (local_280 != local_268) {
                        operator_delete(local_280);
                      }
                      SmallVectorBase<slang::ast::EvalContext::Frame>::cleanup
                                (&local_338,(EVP_PKEY_CTX *)context_00);
                      goto LAB_00748ea5;
                    }
                    pTVar12 = local_440->errorType;
                    local_454 = 0;
                    local_388 = (undefined1  [8])0x0;
                    _Stack_380._M_extent_value = 0;
                    local_430 = (undefined1  [16])
                                slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)local_450);
                    pSVar11 = BumpAllocator::
                              emplace<slang::ast::StreamingConcatenationExpression,slang::ast::Type_const&,unsigned_long&,unsigned_int,std::span<slang::ast::StreamingConcatenationExpression::StreamExpression_const,18446744073709551615ul>,slang::SourceRange>
                                        (&pCVar5->super_BumpAllocator,pTVar12,&local_448,&local_454,
                                         (span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>
                                          *)local_388,(SourceRange *)local_430);
                    pSVar11 = (StreamingConcatenationExpression *)
                              Expression::badExpr(pCVar5,&pSVar11->super_Expression);
                    goto LAB_0074936d;
                  }
                }
              }
              ASTContext::addDiag((ASTContext *)local_438,(DiagCode)0x310007,
                                  *(SourceRange *)&this->lastMember);
              pCVar5 = local_440;
              pTVar12 = local_440->errorType;
              local_454 = 0;
              local_388 = (undefined1  [8])0x0;
              _Stack_380._M_extent_value = 0;
              local_430 = (undefined1  [16])
                          slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)local_450);
              pSVar11 = BumpAllocator::
                        emplace<slang::ast::StreamingConcatenationExpression,slang::ast::Type_const&,unsigned_long&,unsigned_int,std::span<slang::ast::StreamingConcatenationExpression::StreamExpression_const,18446744073709551615ul>,slang::SourceRange>
                                  (&pCVar5->super_BumpAllocator,pTVar12,&local_448,&local_454,
                                   (span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>
                                    *)local_388,(SourceRange *)local_430);
              pSVar11 = (StreamingConcatenationExpression *)
                        Expression::badExpr(pCVar5,&pSVar11->super_Expression);
              goto LAB_0074936d;
            }
            cVar22 = '\0';
            pEVar15 = (Expression *)0x0;
LAB_00748ea5:
            if (**(int **)(pSVar2 + 1) != 0x1bb) {
              pTVar14 = pTVar12->canonical;
              if (pTVar14 == (Type *)0x0) {
                Type::resolveCanonical(pTVar12);
                pTVar14 = pTVar12->canonical;
              }
              if (((pTVar14->super_Symbol).kind == UnpackedUnionType) &&
                 (bVar7 = Type::isTaggedUnion(pTVar12), !bVar7)) {
                pTVar14 = pTVar12->canonical;
                if (pTVar14 == (Type *)0x0) {
                  Type::resolveCanonical(pTVar12);
                  pTVar14 = pTVar12->canonical;
                }
                if (*(int *)&pTVar14[1].super_Symbol.nextInScope != 0) {
                  Scope::elaborate((Scope *)(pTVar14 + 1));
                }
                SVar10 = pTVar14[1].super_Symbol.location;
                if (SVar10 != (SourceLocation)0x0) {
                  pTVar12 = DeclaredType::getType((DeclaredType *)((long)SVar10 + 0x40));
                }
              }
              bVar7 = Type::isBitstreamType(pTVar12,(bool)((byte)(local_410 >> 0x14) & 1));
              if (!bVar7) {
                pDVar18 = ASTContext::addDiag((ASTContext *)local_438,(DiagCode)0x2b0007,
                                              *(SourceRange *)&this->lastMember);
                pCVar5 = local_440;
                ast::operator<<(pDVar18,((not_null<const_slang::ast::Type_*> *)&this->thisSym)->ptr)
                ;
                pTVar12 = pCVar5->errorType;
                local_454 = 0;
                local_388 = (undefined1  [8])0x0;
                _Stack_380._M_extent_value = 0;
                local_430 = (undefined1  [16])
                            slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)local_450);
                pSVar11 = BumpAllocator::
                          emplace<slang::ast::StreamingConcatenationExpression,slang::ast::Type_const&,unsigned_long&,unsigned_int,std::span<slang::ast::StreamingConcatenationExpression::StreamExpression_const,18446744073709551615ul>,slang::SourceRange>
                                    (&pCVar5->super_BumpAllocator,pTVar12,&local_448,&local_454,
                                     (span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>
                                      *)local_388,(SourceRange *)local_430);
                pSVar11 = (StreamingConcatenationExpression *)
                          Expression::badExpr(pCVar5,&pSVar11->super_Expression);
                goto LAB_0074936d;
              }
              SVar23.endLoc = in_R8;
              SVar23.startLoc = *(SourceLocation *)&this->deferredMemberIndex;
              bVar7 = Bitstream::checkClassAccess
                                ((Bitstream *)pTVar12,local_438,
                                 (ASTContext *)((SourceRange *)&this->lastMember)->startLoc,SVar23);
              pCVar5 = local_440;
              if (!bVar7) {
                pTVar12 = local_440->errorType;
                local_454 = 0;
                local_388 = (undefined1  [8])0x0;
                _Stack_380._M_extent_value = 0;
                local_430 = (undefined1  [16])
                            slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)local_450);
                pSVar11 = BumpAllocator::
                          emplace<slang::ast::StreamingConcatenationExpression,slang::ast::Type_const&,unsigned_long&,unsigned_int,std::span<slang::ast::StreamingConcatenationExpression::StreamExpression_const,18446744073709551615ul>,slang::SourceRange>
                                    (&pCVar5->super_BumpAllocator,pTVar12,&local_448,&local_454,
                                     (span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>
                                      *)local_388,(SourceRange *)local_430);
                pSVar11 = (StreamingConcatenationExpression *)
                          Expression::badExpr(pCVar5,&pSVar11->super_Expression);
                goto LAB_0074936d;
              }
            }
            uVar6 = local_414;
            if (*(ExpressionKind *)&this->compilation == Streaming) {
              pSVar17 = this[1].nameMap;
            }
            else if (pEVar15 == (Expression *)0x0) {
              pSVar17 = (SymbolMap *)Type::getBitstreamWidth(pTVar12);
            }
            else if (cVar22 == '\0') {
              pSVar17 = (SymbolMap *)0x0;
            }
            else {
              pTVar12 = Type::getArrayElementType(pTVar12);
              uVar16 = Type::getBitstreamWidth(pTVar12);
              auVar3._8_8_ = 0;
              auVar3._0_8_ = uVar16;
              auVar3 = auVar3 * ZEXT416(uVar6);
              pSVar17 = auVar3._0_8_;
              if ((auVar3._8_8_ != 0) || ((SymbolMap *)0x3fffffff8 < pSVar17)) {
                ASTContext::addDiag((ASTContext *)local_438,(DiagCode)0x180009,pEVar15->sourceRange)
                ;
                pCVar5 = local_440;
                pTVar12 = local_440->errorType;
                local_454 = 0;
                local_388 = (undefined1  [8])0x0;
                _Stack_380._M_extent_value = 0;
                local_430 = (undefined1  [16])
                            slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)local_450);
                pSVar11 = BumpAllocator::
                          emplace<slang::ast::StreamingConcatenationExpression,slang::ast::Type_const&,unsigned_long&,unsigned_int,std::span<slang::ast::StreamingConcatenationExpression::StreamExpression_const,18446744073709551615ul>,slang::SourceRange>
                                    (&pCVar5->super_BumpAllocator,pTVar12,&local_448,&local_454,
                                     (span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>
                                      *)local_388,(SourceRange *)local_430);
                pSVar11 = (StreamingConcatenationExpression *)
                          Expression::badExpr(pCVar5,&pSVar11->super_Expression);
                goto LAB_0074936d;
              }
            }
            local_420 = (long)&(pSVar17->table_).
                               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::Symbol_*>_>_>
                               .arrays.groups_size_index + local_420;
            if (0x3fffffff8 < local_420) {
              SVar23 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)local_450);
              ASTContext::addDiag((ASTContext *)local_438,(DiagCode)0x180009,SVar23);
              pTVar12 = local_440->errorType;
              local_454 = 0;
              local_388 = (undefined1  [8])0x0;
              _Stack_380._M_extent_value = 0;
              local_430 = (undefined1  [16])
                          slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)local_450);
              pSVar11 = BumpAllocator::
                        emplace<slang::ast::StreamingConcatenationExpression,slang::ast::Type_const&,unsigned_long&,unsigned_int,std::span<slang::ast::StreamingConcatenationExpression::StreamExpression_const,18446744073709551615ul>,slang::SourceRange>
                                  (&local_440->super_BumpAllocator,pTVar12,&local_448,&local_454,
                                   (span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>
                                    *)local_388,(SourceRange *)local_430);
              pSVar11 = (StreamingConcatenationExpression *)
                        Expression::badExpr(local_440,&pSVar11->super_Expression);
              goto LAB_0074936d;
            }
            local_378.m_bits = (underlying_type)CONCAT14(cVar22,uVar6);
            local_388 = (undefined1  [8])this;
            _Stack_380._M_extent_value = (size_t)pEVar15;
            SmallVectorBase<slang::ast::StreamingConcatenationExpression::StreamExpression>::
            emplace_back<slang::ast::StreamingConcatenationExpression::StreamExpression>
                      (local_400,(StreamExpression *)local_388);
            lVar20 = local_408 + 0x30;
            uVar21 = uVar21 - 1;
            src = extraout_RDX_03;
            context = (ASTContext *)local_438;
            comp = local_440;
          } while (uVar21 != 0);
        }
        pTVar12 = comp->voidType;
        iVar8 = SmallVectorBase<slang::ast::StreamingConcatenationExpression::StreamExpression>::
                copy(local_400,(EVP_PKEY_CTX *)comp,(EVP_PKEY_CTX *)src);
        local_388 = (undefined1  [8])CONCAT44(extraout_var_00,iVar8);
        _Stack_380._M_extent_value = extraout_RDX_02;
        local_430 = (undefined1  [16])
                    slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)local_450);
        pSVar11 = BumpAllocator::
                  emplace<slang::ast::StreamingConcatenationExpression,slang::ast::Type_const&,unsigned_long&,unsigned_long&,std::span<slang::ast::StreamingConcatenationExpression::StreamExpression_const,18446744073709551615ul>,slang::SourceRange>
                            (&comp->super_BumpAllocator,pTVar12,&local_448,&local_420,
                             (span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>
                              *)local_388,(SourceRange *)local_430);
        if ((((bitmask<slang::ast::ASTFlags> *)&(((Type *)context)->super_Symbol).name._M_str)->
             m_bits & 0x80) == 0) {
          uVar21 = 0xffffff;
          if (local_420 < 0xffffff) {
            uVar21 = local_420;
          }
          pTVar12 = Compilation::getType
                              (comp,(bitwidth_t)uVar21,(bitmask<slang::ast::IntegralFlags>)0x2);
          assignmentRange.endLoc = (SourceLocation)0x0;
          assignmentRange.startLoc = (pSVar11->super_Expression).sourceRange.endLoc;
          pSVar11 = (StreamingConcatenationExpression *)
                    Expression::convertAssignment
                              ((Expression *)context,(ASTContext *)pTVar12,(Type *)pSVar11,
                               (Expression *)(pSVar11->super_Expression).sourceRange.startLoc,
                               assignmentRange,(Expression **)0x0,in_stack_fffffffffffffba0);
        }
LAB_0074936d:
        if (local_400[0].data_ == (pointer)((long)local_400 + 0x18U)) {
          return &pSVar11->super_Expression;
        }
        operator_delete(local_400[0].data_);
        return &pSVar11->super_Expression;
      }
      pDVar18 = ASTContext::addDiag(context,(DiagCode)0x2d0007,pEVar15->sourceRange);
      SVar10 = (((pEVar15->type).ptr)->super_Symbol).location;
      if (((ulong)SVar10 & 0xfffffff) != 0) {
        Diagnostic::addNote(pDVar18,(DiagCode)0x50001,SVar10);
      }
    }
    else {
      value = ASTContext::evalInteger(context,pEVar15,(bitmask<slang::ast::EvalFlags>)0x0);
      bVar7 = ASTContext::requireGtZero(context,value,pEVar15->sourceRange);
      if (bVar7) {
        local_448 = (ulong)value.super__Optional_base<int,_true,_true>._M_payload.
                           super__Optional_payload_base<int> & 0xffffffff;
        src = extraout_RDX_00;
        goto LAB_00748b2e;
      }
    }
  }
  pTVar12 = comp->errorType;
  syntax = local_450;
LAB_00748a82:
  auVar4._12_4_ = 0;
  auVar4._0_12_ = local_430._4_12_;
  local_430 = auVar4 << 0x20;
  _Stack_380._M_extent_value = 0;
  local_388 = (undefined1  [8])0x0;
  local_400[0]._0_16_ =
       (undefined1  [16])slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
  pSVar11 = BumpAllocator::
            emplace<slang::ast::StreamingConcatenationExpression,slang::ast::Type_const&,unsigned_long&,unsigned_int,std::span<slang::ast::StreamingConcatenationExpression::StreamExpression_const,18446744073709551615ul>,slang::SourceRange>
                      (&comp->super_BumpAllocator,pTVar12,&local_448,(uint *)local_430,
                       (span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>
                        *)local_388,(SourceRange *)local_400);
  pSVar11 = (StreamingConcatenationExpression *)Expression::badExpr(comp,&pSVar11->super_Expression)
  ;
  return &pSVar11->super_Expression;
}

Assistant:

Expression& StreamingConcatenationExpression::fromSyntax(
    Compilation& comp, const StreamingConcatenationExpressionSyntax& syntax,
    const ASTContext& context) {

    const bool isDestination = context.flags.has(ASTFlags::LValue);
    const bool isRightToLeft = syntax.operatorToken.kind == TokenKind::LeftShift;
    uint64_t sliceSize = 0;

    auto badResult = [&]() -> Expression& {
        return badExpr(comp, comp.emplace<StreamingConcatenationExpression>(
                                 comp.getErrorType(), sliceSize, 0u,
                                 std::span<const StreamExpression>(), syntax.sourceRange()));
    };

    if (!context.flags.has(ASTFlags::StreamingAllowed) &&
        (isDestination || !comp.hasFlag(CompilationFlags::AllowSelfDeterminedStreamConcat))) {
        context.addDiag(diag::BadStreamContext, syntax.operatorToken.location());
        return badResult();
    }

    if (syntax.sliceSize) {
        // The slice_size determines the size of each block. If specified, it may be a constant
        // integral expression or a simple type.
        auto& sliceExpr = bind(*syntax.sliceSize, context, ASTFlags::AllowDataType);
        if (sliceExpr.bad())
            return badResult();

        if (sliceExpr.kind == ExpressionKind::DataType) {
            if (!sliceExpr.type->isFixedSize()) {
                auto& diag = context.addDiag(diag::BadStreamSlice, sliceExpr.sourceRange);
                if (sliceExpr.type->location)
                    diag.addNote(diag::NoteDeclarationHere, sliceExpr.type->location);
                return badResult();
            }
            sliceSize = sliceExpr.type->getBitstreamWidth();
        }
        else {
            // It shall be an error for the value to be zero or negative.
            std::optional<int32_t> count = context.evalInteger(sliceExpr);
            if (!context.requireGtZero(count, sliceExpr.sourceRange))
                return badResult();
            sliceSize = static_cast<uint32_t>(*count);
        }

        if (!isRightToLeft) {
            // Left-to-right streaming using >> shall cause the slice_size to be ignored and no
            // re-ordering performed.
            sliceSize = 0;
            context.addDiag(diag::IgnoredSlice, syntax.sliceSize->sourceRange());
        }
    }
    else if (isRightToLeft) {
        // If a slice_size is not specified, the default is 1.
        sliceSize = 1;
    }

    uint64_t bitstreamWidth = 0;
    SmallVector<StreamExpression, 4> buffer;
    for (const auto argSyntax : syntax.expressions) {
        auto& arg = selfDetermined(comp, *argSyntax->expression, context,
                                   ASTFlags::StreamingAllowed);
        if (arg.bad())
            return badResult();

        const Type* argType = arg.type;
        const Expression* withExpr = nullptr;
        std::optional<bitwidth_t> constantWithWidth;
        if (argSyntax->withRange) {
            // The expression before the with can be any one-dimensional unpacked array
            // (including a queue).
            if (!argType->isUnpackedArray() || argType->isAssociativeArray() ||
                !argType->getArrayElementType()->isFixedSize()) {
                context.addDiag(diag::BadStreamWithType, arg.sourceRange);
                return badResult();
            }

            withExpr = &bindSelector(comp, arg, *argSyntax->withRange->range,
                                     context.resetFlags(ASTFlags::StreamingWithRange));
            if (withExpr->bad())
                return badResult();

            // Try to get the bounds of the selection, if they are constant.
            // If they are constant, we've already done bounds checking and
            // max size checking on them.
            EvalContext evalCtx(context);
            auto range = withExpr->evalSelector(evalCtx, /* enforceBounds */ false);
            if (range)
                constantWithWidth = range->width();
        }

        if (argSyntax->expression->kind != SyntaxKind::StreamingConcatenationExpression) {
            // Unpacked unions get "unwrapped" to their first member when streaming.
            if (argType->isUnpackedUnion() && !argType->isTaggedUnion()) {
                auto& uu = argType->getCanonicalType().as<UnpackedUnionType>();
                auto members = uu.members();
                if (members.begin() != members.end())
                    argType = &members.begin()->as<ValueSymbol>().getType();
            }

            if (!argType->isBitstreamType(isDestination)) {
                context.addDiag(diag::BadStreamExprType, arg.sourceRange) << *arg.type;
                return badResult();
            }

            if (!Bitstream::checkClassAccess(*argType, context, arg.sourceRange))
                return badResult();
        }

        uint64_t argWidth = 0;
        if (arg.kind == ExpressionKind::Streaming) {
            argWidth = arg.as<StreamingConcatenationExpression>().getBitstreamWidth();
        }
        else if (withExpr) {
            if (constantWithWidth) {
                auto rangeBits = checkedMulU64(argType->getArrayElementType()->getBitstreamWidth(),
                                               *constantWithWidth);
                if (!rangeBits || rangeBits > Type::MaxBitWidth) {
                    context.addDiag(diag::ObjectTooLarge, withExpr->sourceRange);
                    return badResult();
                }

                argWidth = *rangeBits;
            }
        }
        else {
            argWidth = argType->getBitstreamWidth();
        }

        bitstreamWidth += argWidth;
        if (bitstreamWidth > Type::MaxBitWidth) {
            context.addDiag(diag::ObjectTooLarge, syntax.sourceRange());
            return badResult();
        }

        buffer.push_back({&arg, withExpr, constantWithWidth});
    }

    // So normally the type of a streaming concatenation is never inspected,
    // since it can only be used in assignments and there is explicit handling
    // of these expressions there. We use a void type for the result to represent
    // this (also because otherwise what type can we use for e.g. non fixed-size
    // streams). However, in VCS compat mode the error about requiring an assignment
    // context can be silenced, so we need to come up with a real result type here,
    // which we do by converting to a packed bit vector of bitstream width.
    auto& result = *comp.emplace<StreamingConcatenationExpression>(
        comp.getVoidType(), sliceSize, bitstreamWidth, buffer.ccopy(comp), syntax.sourceRange());

    if (!context.flags.has(ASTFlags::StreamingAllowed)) {
        // Cap the width so we don't overflow. The conversion will error for us
        // since the target width will be less than the source width.
        auto width = std::min(bitstreamWidth, (uint64_t)SVInt::MAX_BITS);
        auto& type = comp.getType(bitwidth_t(width), IntegralFlags::FourState);
        return convertAssignment(context, type, result, result.sourceRange);
    }

    return result;
}